

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O1

void __thiscall
duckdb::PrimitiveDictionary<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetStringOperator>::
Insert(PrimitiveDictionary<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetStringOperator> *this,
      string_t value)

{
  idx_t iVar1;
  bool bVar2;
  primitive_dictionary_entry_t *ppVar3;
  anon_union_16_2_67f50693_for_value local_20;
  
  local_20.pointer.ptr = (char *)value.value._8_8_;
  local_20._0_8_ = value.value._0_8_;
  if ((this->full == false) &&
     (ppVar3 = Lookup(this,(string_t *)&local_20.pointer), ppVar3->index == 0xffffffff)) {
    if ((this->size + 1 <= this->maximum_size) &&
       (bVar2 = AddToTarget<duckdb::string_t,_0>(this,(string_t *)&local_20.pointer), bVar2)) {
      *(undefined8 *)&(ppVar3->value).value = local_20._0_8_;
      (ppVar3->value).value.pointer.ptr = local_20.pointer.ptr;
      iVar1 = this->size;
      this->size = iVar1 + 1;
      ppVar3->index = (uint32_t)iVar1;
      return;
    }
    this->full = true;
  }
  return;
}

Assistant:

void Insert(SRC value) {
		if (full) {
			return;
		}
		auto &entry = Lookup(value);
		if (entry.IsEmpty()) {
			if (size + 1 > maximum_size || !AddToTarget(value)) {
				full = true;
				return;
			}
			entry.value = value;
			entry.index = size++;
		}
	}